

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

uint32_t x86_ldl_phys_x86_64(CPUState *cs,hwaddr addr)

{
  uint uVar1;
  _func_int_CPUState_ptr_MemTxAttrs_conflict *p_Var2;
  int asidx;
  uint32_t uVar3;
  AddressSpace *as;
  MemTxAttrs unaff_EBX;
  
  uVar1 = *(uint *)(cs[1].tb_jmp_cache + 0x101);
  p_Var2 = cs->cc->asidx_from_attrs;
  if (p_Var2 == (_func_int_CPUState_ptr_MemTxAttrs_conflict *)0x0) {
    asidx = 0;
  }
  else {
    asidx = (*p_Var2)((CPUState_conflict *)cs,unaff_EBX);
    if ((asidx < 0) || (cs->num_ases <= asidx)) {
      __assert_fail("ret < cpu->num_ases && ret >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/hw/core/cpu.h"
                    ,0x1a5,"int cpu_asidx_from_attrs(CPUState *, MemTxAttrs)");
    }
  }
  as = cpu_get_address_space_x86_64(cs,asidx);
  uVar3 = address_space_ldl_x86_64
                    ((uc_struct_conflict *)as->uc,as,addr,(MemTxAttrs)(uVar1 >> 0x12 & 2),
                     (MemTxResult *)0x0);
  return uVar3;
}

Assistant:

uint32_t x86_ldl_phys(CPUState *cs, hwaddr addr)
{
    X86CPU *cpu = X86_CPU(cs);
    CPUX86State *env = &cpu->env;
    MemTxAttrs attrs = cpu_get_mem_attrs(env);
    AddressSpace *as = cpu_addressspace(cs, attrs);

#ifdef UNICORN_ARCH_POSTFIX
    return glue(address_space_ldl, UNICORN_ARCH_POSTFIX)(as->uc, as, addr, attrs, NULL);
#else
    return address_space_ldl(as->uc, as, addr, attrs, NULL);
#endif
}